

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

SourceTextModuleRecord * __thiscall
Js::JavascriptLibrary::GetModuleRecord(JavascriptLibrary *this,uint moduleId)

{
  uint uVar1;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  
  uVar1 = (((this->moduleRecordList).ptr)->
          super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).count
  ;
  if ((int)uVar1 < 0 || uVar1 <= moduleId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1c9c,
                                "((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()))"
                                ,
                                "(moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count())"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = (this->moduleRecordList).ptr;
  if (moduleId <
      (uint)(this_00->
            super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
            count) {
    pTVar5 = JsUtil::
             List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,moduleId);
    return pTVar5->ptr;
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

SourceTextModuleRecord* JavascriptLibrary::GetModuleRecord(uint moduleId)
    {
        Assert((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()));
        if (moduleId >= (uint)moduleRecordList->Count())
        {
            Js::Throw::FatalInternalError();
        }
        return moduleRecordList->Item(moduleId);
    }